

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_label.cc
# Opt level: O0

void no_label::output_and_account_no_label_example(vw *all,example *ec)

{
  size_t sVar1;
  int *piVar2;
  long in_RSI;
  undefined8 *in_RDI;
  int f;
  size_t i;
  example *ec_00;
  vw *all_00;
  ulong local_38;
  
  shared_data::update((shared_data *)*in_RDI,(bool)(*(byte *)(in_RSI + 0x68c8) & 1),false,
                      *(float *)(in_RSI + 0x68b0),*(float *)(in_RSI + 0x6870),
                      *(size_t *)(in_RSI + 0x68a0));
  ec_00 = *(example **)(in_RSI + 0x6878);
  all_00 = *(vw **)(in_RSI + 0x6880);
  (*(code *)in_RDI[0x6a7])
            (*(undefined4 *)(in_RSI + 0x68a8),0xbf800000,*(undefined4 *)(in_RDI + 0x6a6));
  local_38 = 0;
  while( true ) {
    sVar1 = v_array<int>::size((v_array<int> *)(in_RDI + 0x6a2));
    if (sVar1 <= local_38) break;
    piVar2 = v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x6a2),local_38);
    ec_00 = *(example **)(in_RSI + 0x6878);
    all_00 = *(vw **)(in_RSI + 0x6880);
    (*(code *)in_RDI[0x6a7])(*(undefined4 *)(in_RSI + 0x6850),0,*piVar2);
    local_38 = local_38 + 1;
  }
  print_no_label_update(all_00,ec_00);
  return;
}

Assistant:

void output_and_account_no_label_example(vw& all, example& ec)
{
  all.sd->update(ec.test_only, false, ec.loss, ec.weight, ec.num_features);

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    all.print(f, ec.pred.scalar, 0, ec.tag);
  }

  print_no_label_update(all, ec);
}